

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall
QTreeModel::sortItems(QTreeModel *this,QList<QTreeWidgetItem_*> *items,int column,SortOrder order)

{
  uint uVar1;
  QTreeWidgetItem *pQVar2;
  parameter_type t;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_00;
  int iVar3;
  pointer ppVar4;
  iterator __seed;
  iterator __last;
  int iVar5;
  undefined1 *puVar6;
  code *__comp;
  long lVar7;
  long in_FS_OFFSET;
  Bucket BVar8;
  QModelIndex local_c8;
  QModelIndex local_b0;
  QList<QModelIndex> local_98;
  QList<std::pair<QTreeWidgetItem_*,_int>_> local_78;
  _Temporary_buffer<QList<std::pair<QTreeWidgetItem_*,_int>_>::iterator,_std::pair<QTreeWidgetItem_*,_int>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)&this->field_0x8 + 0x88) == 0) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (pair<QTreeWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    QList<std::pair<QTreeWidgetItem_*,_int>_>::QList(&local_78,(items->d).size);
    if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
      lVar7 = 0;
      puVar6 = (undefined1 *)0x0;
      do {
        pQVar2 = (items->d).ptr[(long)puVar6];
        ppVar4 = QList<std::pair<QTreeWidgetItem_*,_int>_>::data(&local_78);
        *(QTreeWidgetItem **)((long)&ppVar4->first + lVar7) = pQVar2;
        ppVar4 = QList<std::pair<QTreeWidgetItem_*,_int>_>::data(&local_78);
        *(int *)((long)&ppVar4->second + lVar7) = (int)puVar6;
        puVar6 = puVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (puVar6 < (ulong)local_78.d.size);
    }
    __comp = itemGreaterThan;
    if (order == AscendingOrder) {
      __comp = itemLessThan;
    }
    __seed = QList<std::pair<QTreeWidgetItem_*,_int>_>::begin(&local_78);
    __last = QList<std::pair<QTreeWidgetItem_*,_int>_>::end(&local_78);
    if (__seed.i != __last.i) {
      lVar7 = (long)__last.i - (long)__seed.i >> 4;
      local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
      std::
      _Temporary_buffer<QList<std::pair<QTreeWidgetItem_*,_int>_>::iterator,_std::pair<QTreeWidgetItem_*,_int>_>
      ::_Temporary_buffer(&local_58,__seed,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58._M_buffer == (pair<QTreeWidgetItem_*,_int> *)0x0) {
        std::
        __inplace_stable_sort<QList<std::pair<QTreeWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTreeWidgetItem*,int>const&,std::pair<QTreeWidgetItem*,int>const&)>>
                  (__seed,__last,
                   (_Iter_comp_iter<bool_(*)(const_std::pair<QTreeWidgetItem_*,_int>_&,_const_std::pair<QTreeWidgetItem_*,_int>_&)>
                    )__comp);
      }
      else {
        std::
        __stable_sort_adaptive<QList<std::pair<QTreeWidgetItem*,int>>::iterator,std::pair<QTreeWidgetItem*,int>*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTreeWidgetItem*,int>const&,std::pair<QTreeWidgetItem*,int>const&)>>
                  (__seed,__last,local_58._M_buffer,local_58._M_len,
                   (_Iter_comp_iter<bool_(*)(const_std::pair<QTreeWidgetItem_*,_int>_&,_const_std::pair<QTreeWidgetItem_*,_int>_&)>
                    )__comp);
      }
      operator_delete(local_58._M_buffer,local_58._M_len << 4);
    }
    local_58._M_original_len = 0;
    local_58._M_len = 0;
    local_58._M_buffer = (pointer)0x0;
    local_98.d.size = 0;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (QModelIndex *)0x0;
    local_b0.r = -1;
    local_b0.c = -1;
    local_b0.i = 0;
    local_b0.m.ptr = (QAbstractItemModel *)0x0;
    iVar3 = (**(code **)(*(long *)this + 0x80))(this);
    if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
      puVar6 = (undefined1 *)0x0;
      do {
        uVar1 = local_78.d.ptr[(long)puVar6].second;
        if (puVar6 != (undefined1 *)(ulong)uVar1) {
          t = local_78.d.ptr[(long)puVar6].first;
          QList<QTreeWidgetItem_*>::replace(items,(qsizetype)puVar6,t);
          if (0 < iVar3) {
            iVar5 = 0;
            do {
              local_b0.c = iVar5;
              local_b0.r = uVar1;
              this_00 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                          **)(*(long *)&this->field_0x8 + 0x90);
              local_c8.r = uVar1;
              local_c8.c = iVar5;
              local_c8.i = (quintptr)t;
              local_c8.m.ptr = &this->super_QAbstractItemModel;
              local_b0.i = (quintptr)t;
              local_b0.m.ptr = &this->super_QAbstractItemModel;
              if (this_00 !=
                  (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   *)0x0) {
                BVar8 = QHashPrivate::
                        Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                        ::findBucket<QtPrivate::QModelIndexWrapper>
                                  (this_00,(QModelIndexWrapper *)&local_c8);
                if ((BVar8.span[BVar8.index] != (Span)0xff) && (*(long *)(BVar8.span + 0x80) != 0))
                {
                  local_c8.r = (int)puVar6;
                  local_c8.c = iVar5;
                  local_c8.i = (quintptr)t;
                  local_c8.m.ptr = &this->super_QAbstractItemModel;
                  QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                            ((QMovableArrayOps<QModelIndex> *)&local_58,
                             (qsizetype)local_58._M_buffer,&local_b0);
                  QList<QModelIndex>::end((QList<QModelIndex> *)&local_58);
                  QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                            ((QMovableArrayOps<QModelIndex> *)&local_98,local_98.d.size,&local_c8);
                  QList<QModelIndex>::end(&local_98);
                }
              }
              iVar5 = iVar5 + 1;
            } while (iVar3 != iVar5);
          }
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 < (ulong)local_78.d.size);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict *)this,(QList_conflict *)&local_58);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x18,0x10);
      }
    }
    if ((QArrayData *)local_58._M_original_len != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_58._M_original_len,0x18,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeModel::sortItems(QList<QTreeWidgetItem*> *items, int column, Qt::SortOrder order)
{
    // see QTreeViewItem::operator<
    Q_UNUSED(column);
    if (isChanging())
        return;

    // store the original order of indexes
    QList<std::pair<QTreeWidgetItem *, int>> sorting(items->size());
    for (int i = 0; i < sorting.size(); ++i) {
        sorting[i].first = items->at(i);
        sorting[i].second = i;
    }

    // do the sorting
    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);

    QModelIndexList fromList;
    QModelIndexList toList;
    int colCount = columnCount();
    for (int r = 0; r < sorting.size(); ++r) {
        int oldRow = sorting.at(r).second;
        if (oldRow == r)
            continue;
        QTreeWidgetItem *item = sorting.at(r).first;
        items->replace(r, item);
        for (int c = 0; c < colCount; ++c) {
            QModelIndex from = createIndex(oldRow, c, item);
            if (static_cast<QAbstractItemModelPrivate *>(d_ptr.data())->persistent.indexes.contains(from)) {
                QModelIndex to = createIndex(r, c, item);
                fromList << from;
                toList << to;
            }
        }
    }
    changePersistentIndexList(fromList, toList);
}